

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O0

void __thiscall Fossilize::ApplicationInfoFilter::ApplicationInfoFilter(ApplicationInfoFilter *this)

{
  Impl *this_00;
  ApplicationInfoFilter *this_local;
  
  this_00 = (Impl *)operator_new(0x120);
  Impl::Impl(this_00);
  this->impl = this_00;
  return;
}

Assistant:

ApplicationInfoFilter::ApplicationInfoFilter()
{
	impl = new Impl;
}